

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeWidgetItem::insertChild(QTreeWidgetItem *this,int index,QTreeWidgetItem *child)

{
  bool bVar1;
  QTreeWidgetItem *pQVar2;
  qsizetype qVar3;
  QTreeModel *m;
  long in_RDX;
  int in_ESI;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  int c;
  QTreeWidgetItem *i;
  int cols;
  QTreeModel *model;
  QStack<QTreeWidgetItem_*> stack;
  SkipSorting skipSorting;
  QTreeWidgetItem **in_stack_ffffffffffffff48;
  QTreeView *in_stack_ffffffffffffff50;
  QObject *in_stack_ffffffffffffff58;
  QTreeWidgetItemPrivate *in_stack_ffffffffffffff70;
  QList<QList<QWidgetItemData>_> *in_stack_ffffffffffffff78;
  int local_7c;
  parameter_type item;
  undefined1 *asize;
  QTreeWidgetItem *in_stack_ffffffffffffffc8;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < in_ESI) {
    pQVar2 = (QTreeWidgetItem *)(long)in_ESI;
    item = in_RDI;
    qVar3 = QList<QTreeWidgetItem_*>::size(&in_RDI->children);
    if (((((long)pQVar2 <= qVar3) && (in_RDX != 0)) && (*(long *)(in_RDX + 0x28) == 0)) &&
       (*(long *)(in_RDX + 0x38) == 0)) {
      m = treeModel(pQVar2,(QTreeWidget *)in_stack_ffffffffffffff58);
      if (m == (QTreeModel *)0x0) {
        *(parameter_type *)(in_RDX + 0x38) = in_RDI;
        QList<QTreeWidgetItem_*>::insert
                  ((QList<QTreeWidgetItem_*> *)in_stack_ffffffffffffff58,
                   (qsizetype)in_stack_ffffffffffffff50,in_RDI);
      }
      else {
        local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QTreeModel::SkipSorting::SkipSorting((SkipSorting *)local_18,m);
        if (m->rootItem == in_RDI) {
          *(undefined8 *)(in_RDX + 0x38) = 0;
        }
        else {
          *(parameter_type *)(in_RDX + 0x38) = in_RDI;
        }
        bVar1 = QTreeView::isSortingEnabled(in_stack_ffffffffffffff50);
        if ((bVar1) && (bVar1 = QBasicTimer::isActive(&m->sortPendingTimer), !bVar1)) {
          QBasicTimer::start((QBasicTimer *)pQVar2,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                             in_stack_ffffffffffffff58);
        }
        QTreeModel::beginInsertItems
                  ((QTreeModel *)in_RDI,pQVar2,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                   (int)in_stack_ffffffffffffff58);
        QModelIndex::QModelIndex((QModelIndex *)0x91346f);
        (**(code **)(*(long *)m + 0x80))(m,&stack0xffffffffffffffc8);
        asize = &DAT_aaaaaaaaaaaaaaaa;
        QStack<QTreeWidgetItem_*>::QStack((QStack<QTreeWidgetItem_*> *)0x9134b7);
        QStack<QTreeWidgetItem_*>::push
                  ((QStack<QTreeWidgetItem_*> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48)
        ;
        while (bVar1 = QList<QTreeWidgetItem_*>::isEmpty((QList<QTreeWidgetItem_*> *)0x9134d3),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          pQVar2 = QStack<QTreeWidgetItem_*>::pop((QStack<QTreeWidgetItem_*> *)0x9134e8);
          pQVar2->view = in_RDI->view;
          QList<QList<QWidgetItemData>_>::reserve(in_stack_ffffffffffffff78,(qsizetype)asize);
          local_7c = 0;
          while( true ) {
            in_stack_ffffffffffffff50 = (QTreeView *)(long)local_7c;
            qVar3 = QList<QTreeWidgetItem_*>::size(&pQVar2->children);
            if (qVar3 <= (long)in_stack_ffffffffffffff50) break;
            QList<QTreeWidgetItem_*>::at
                      ((QList<QTreeWidgetItem_*> *)in_stack_ffffffffffffff50,
                       (qsizetype)in_stack_ffffffffffffff48);
            QStack<QTreeWidgetItem_*>::push
                      ((QStack<QTreeWidgetItem_*> *)in_stack_ffffffffffffff50,
                       in_stack_ffffffffffffff48);
            local_7c = local_7c + 1;
          }
        }
        QList<QTreeWidgetItem_*>::insert
                  ((QList<QTreeWidgetItem_*> *)m,(qsizetype)in_stack_ffffffffffffff50,in_RDI);
        QTreeWidgetItemPrivate::updateHiddenStatus
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffffc8,
                   SUB81((ulong)in_RDI >> 0x38,0));
        QTreeModel::endInsertItems((QTreeModel *)0x9135bc);
        QStack<QTreeWidgetItem_*>::~QStack((QStack<QTreeWidgetItem_*> *)0x9135c6);
        QTreeModel::SkipSorting::~SkipSorting((SkipSorting *)local_18);
      }
      if (*(long *)(in_RDX + 0x38) != 0) {
        QTreeWidgetItemPrivate::propagateDisabled((QTreeWidgetItemPrivate *)in_RDI,item);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeWidgetItem::insertChild(int index, QTreeWidgetItem *child)
{
    if (index < 0 || index > children.size() || child == nullptr || child->view != nullptr || child->par != nullptr)
        return;

    if (QTreeModel *model = treeModel()) {
        QTreeModel::SkipSorting skipSorting(model);
        if (model->rootItem == this)
            child->par = nullptr;
        else
            child->par = this;
        if (view->isSortingEnabled()) {
            // do a delayed sort instead
            if (!model->sortPendingTimer.isActive())
                model->sortPendingTimer.start(0, model);
        }
        model->beginInsertItems(this, index, 1);
        int cols = model->columnCount();
        QStack<QTreeWidgetItem*> stack;
        stack.push(child);
        while (!stack.isEmpty()) {
            QTreeWidgetItem *i = stack.pop();
            i->view = view;
            i->values.reserve(cols);
            for (int c = 0; c < i->children.size(); ++c)
                stack.push(i->children.at(c));
        }
        children.insert(index, child);
        d->updateHiddenStatus(child, true);
        model->endInsertItems();
    } else {
        child->par = this;
        children.insert(index, child);
    }
    if (child->par)
        d->propagateDisabled(child);
}